

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ucum.cpp
# Opt level: O3

void __thiscall UCUMConversions_convert1_Test::TestBody(UCUMConversions_convert1_Test *this)

{
  XMLElement *pXVar1;
  XMLAttribute *pXVar2;
  char *pcVar3;
  ostream *poVar4;
  char *message;
  char *in_R9;
  string unitFromString;
  string unitToString;
  int failConvert;
  precise_unit toUnit;
  precise_unit fromUnit;
  XMLDocument doc;
  char *in_stack_fffffffffffffbc8;
  _Alloc_hider val;
  AssertHelper local_428;
  _Alloc_hider local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbe8;
  char local_410 [8];
  undefined8 in_stack_fffffffffffffbf8;
  internal iVar5;
  undefined7 in_stack_fffffffffffffc01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr;
  string local_3f0;
  undefined7 uStack_3ef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3e8;
  long local_3e0 [2];
  Message local_3d0;
  long local_3c8;
  long local_3c0 [2];
  char *local_3b0;
  AssertHelper local_3a8;
  int local_39c;
  string local_398;
  string local_378;
  precise_unit local_358;
  precise_unit local_348;
  XMLDocument local_338;
  
  tinyxml2::XMLDocument::XMLDocument(&local_338,true,PRESERVE_WHITESPACE);
  tinyxml2::XMLDocument::LoadFile
            (&local_338,
             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/files/UcumFunctionalTests.xml"
            );
  pXVar1 = tinyxml2::XMLNode::FirstChildElement(&local_338.super_XMLNode,"ucumTests");
  pXVar1 = tinyxml2::XMLNode::FirstChildElement(&pXVar1->super_XMLNode,"conversion");
  pXVar1 = tinyxml2::XMLNode::FirstChildElement(&pXVar1->super_XMLNode,"case");
  local_39c = 0;
  if (pXVar1 != (XMLElement *)0x0) {
    do {
      pXVar2 = tinyxml2::XMLElement::FindAttribute(pXVar1,"srcUnit");
      pcVar3 = tinyxml2::XMLAttribute::Value(pXVar2);
      std::__cxx11::string::string(&local_3f0,pcVar3,(allocator *)&local_3d0);
      pXVar2 = tinyxml2::XMLElement::FindAttribute(pXVar1,"dstUnit");
      pcVar3 = tinyxml2::XMLAttribute::Value(pXVar2);
      std::__cxx11::string::string((string *)&local_3d0,pcVar3,(allocator *)&local_420);
      pXVar2 = tinyxml2::XMLElement::FindAttribute(pXVar1,"value");
      local_420._M_p = (pointer)0x0;
      tinyxml2::XMLAttribute::QueryDoubleValue(pXVar2,(double *)&local_420);
      val._M_p = local_420._M_p;
      pXVar2 = tinyxml2::XMLElement::FindAttribute(pXVar1,"outcome");
      local_420._M_p = (char *)0x0;
      tinyxml2::XMLAttribute::QueryDoubleValue(pXVar2,(double *)&local_420);
      local_3b0 = local_420._M_p;
      local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_378,CONCAT71(uStack_3ef,local_3f0),
                 (long)&(local_3e8->_M_dataplus)._M_p + CONCAT71(uStack_3ef,local_3f0));
      local_348 = units::unit_from_string(&local_378,7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != &local_378.field_2) {
        operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
      }
      local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_398,
                 CONCAT44(local_3d0.ss_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_4_,
                          local_3d0.ss_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._0_4_),
                 local_3c8 +
                 CONCAT44(local_3d0.ss_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_4_,
                          local_3d0.ss_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._0_4_));
      local_358 = units::unit_from_string(&local_398,7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_dataplus._M_p != &local_398.field_2) {
        operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
      }
      pcVar3 = (char *)units::convert<units::precise_unit,units::precise_unit>
                                 ((double)val._M_p,&local_348,&local_358);
      iVar5 = (internal)!NAN((double)pcVar3);
      __ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (NAN((double)pcVar3)) {
        testing::Message::Message((Message *)&local_428);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&local_420,(internal *)&stack0xfffffffffffffc00,
                   (AssertionResult *)"std::isnan(act)","true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_ucum.cpp"
                   ,0x27b,local_420._M_p);
        testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_428);
        testing::internal::AssertHelper::~AssertHelper(&local_3a8);
        if (local_420._M_p != local_410) {
          operator_delete(local_420._M_p,(long)local_410 + 1);
        }
        if (local_428.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_428.data_ + 8))();
        }
        if (__ptr != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&stack0xfffffffffffffc08,__ptr);
        }
      }
      else {
        testing::internal::DoubleNearPredFormat
                  (pcVar3,in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbe8,0.0,
                   (double)CONCAT71(in_stack_fffffffffffffc01,iVar5),
                   (double)in_stack_fffffffffffffbf8);
        if ((char)local_420._M_p == '\0') {
          testing::Message::Message((Message *)&stack0xfffffffffffffc00);
          message = "";
          if (in_stack_fffffffffffffbe8 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            message = (in_stack_fffffffffffffbe8->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_428,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_ucum.cpp"
                     ,0x27d,message);
          testing::internal::AssertHelper::operator=(&local_428,(Message *)&stack0xfffffffffffffc00)
          ;
          testing::internal::AssertHelper::~AssertHelper(&local_428);
          if ((long *)CONCAT71(in_stack_fffffffffffffc01,iVar5) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(in_stack_fffffffffffffc01,iVar5) + 8))();
          }
        }
        if (in_stack_fffffffffffffbe8 !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&stack0xfffffffffffffbe8,in_stack_fffffffffffffbe8);
        }
        if (0.001 < ABS((double)local_3b0 - (double)pcVar3) / (double)local_3b0) {
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)CONCAT71(uStack_3ef,local_3f0),
                              (long)local_3e8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," and ",5);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,(char *)CONCAT44(local_3d0.ss_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_,
                                                  local_3d0.ss_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._0_4_),local_3c8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," do not convert ",0x10);
          poVar4 = std::ostream::_M_insert<double>((double)pcVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," and expected=",0xe);
          poVar4 = std::ostream::_M_insert<double>((double)local_3b0);
          local_420._M_p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_420,1);
        }
      }
      pXVar1 = tinyxml2::XMLNode::NextSiblingElement(&pXVar1->super_XMLNode,"case");
      if ((long *)CONCAT44(local_3d0.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           local_3d0.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_4_) != local_3c0) {
        operator_delete((long *)CONCAT44(local_3d0.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._4_4_,
                                         local_3d0.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._0_4_),local_3c0[0] + 1);
      }
      if ((long *)CONCAT71(uStack_3ef,local_3f0) != local_3e0) {
        operator_delete((long *)CONCAT71(uStack_3ef,local_3f0),local_3e0[0] + 1);
      }
    } while (pXVar1 != (XMLElement *)0x0);
  }
  local_3d0.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_3f0,"failConvert","0",&local_39c,(int *)&local_3d0);
  if (local_3f0 == (string)0x0) {
    testing::Message::Message(&local_3d0);
    if (local_3e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_3e8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_420,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_ucum.cpp",
               0x287,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_420,&local_3d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_420);
    if ((long *)CONCAT44(local_3d0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_3d0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_3d0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_3d0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  if (local_3e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3e8,local_3e8);
  }
  tinyxml2::XMLDocument::~XMLDocument(&local_338);
  return;
}

Assistant:

TEST(UCUMConversions, convert1)
{
    tinyxml2::XMLDocument doc;
    doc.LoadFile(TEST_FILE_FOLDER "/UcumFunctionalTests.xml");

    auto cs = doc.FirstChildElement("ucumTests")
                  ->FirstChildElement("conversion")
                  ->FirstChildElement("case");
    int failConvert = 0;
    while (cs != nullptr) {
        std::string unitFromString = cs->FindAttribute("srcUnit")->Value();
        std::string unitToString = cs->FindAttribute("dstUnit")->Value();
        double value = cs->FindAttribute("value")->DoubleValue();
        double outcome = cs->FindAttribute("outcome")->DoubleValue();
        // std::string id = cs->FindAttribute("id")->Value();
        auto fromUnit =
            units::unit_from_string(unitFromString, units::strict_ucum);
        auto toUnit = units::unit_from_string(unitToString, units::strict_ucum);

        double act = units::convert(value, fromUnit, toUnit);
        EXPECT_FALSE(std::isnan(act));
        if (!std::isnan(act)) {
            EXPECT_NEAR(outcome, act, 0.001 * outcome);
            if (std::fabs(outcome - act) / outcome > 0.001) {
                std::cout << unitFromString << " and " << unitToString
                          << " do not convert " << act
                          << " and expected=" << outcome << '\n';
            }
        }

        cs = cs->NextSiblingElement("case");
    }
    EXPECT_EQ(failConvert, 0);
}